

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogCompare.cpp
# Opt level: O3

void __thiscall
ShortResultHandler::testCaseResultComplete(ShortResultHandler *this,TestCaseResultPtr *caseData)

{
  pointer pTVar1;
  pointer pTVar2;
  char *pcVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  TestCaseResultHeader header;
  TestCaseResult fullResult;
  undefined1 local_120 [40];
  _Alloc_hider local_f8;
  char *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  TestCaseResult local_d8;
  long *local_78 [2];
  long local_68 [2];
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_120._0_8_ = local_120 + 0x10;
  local_120._8_8_ = 0;
  local_120[0x10] = '\0';
  local_120._32_4_ = TESTCASETYPE_LAST;
  local_120._36_4_ = TESTSTATUSCODE_LAST;
  local_f8._M_p = (pointer)&local_e8;
  local_f0 = (char *)0x0;
  local_e8._M_local_buf[0] = '\0';
  pTVar1 = (this->m_result->resultHeaders).
           super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar2 = (this->m_result->resultHeaders).
           super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pcVar3 = (caseData->m_ptr->m_casePath)._M_dataplus._M_p;
  strlen(pcVar3);
  std::__cxx11::string::_M_replace((ulong)local_120,0,(char *)0x0,(ulong)pcVar3);
  pcVar4 = local_f0;
  local_120._32_8_ = (ulong)caseData->m_ptr->m_statusCode << 0x20;
  pcVar3 = (caseData->m_ptr->m_statusDetails)._M_dataplus._M_p;
  strlen(pcVar3);
  std::__cxx11::string::_M_replace((ulong)&local_f8,0,pcVar4,(ulong)pcVar3);
  if (local_120._36_4_ == TESTSTATUSCODE_LAST) {
    local_d8.super_TestCaseResultHeader.casePath._M_dataplus._M_p =
         (pointer)&local_d8.super_TestCaseResultHeader.casePath.field_2;
    local_d8.super_TestCaseResultHeader.casePath._M_string_length = 0;
    local_d8.super_TestCaseResultHeader.casePath.field_2._M_local_buf[0] = '\0';
    local_d8.super_TestCaseResultHeader.caseType = TESTCASETYPE_LAST;
    local_d8.super_TestCaseResultHeader.statusCode = TESTSTATUSCODE_LAST;
    local_d8.super_TestCaseResultHeader.statusDetails._M_dataplus._M_p =
         (pointer)&local_d8.super_TestCaseResultHeader.statusDetails.field_2;
    local_d8.super_TestCaseResultHeader.statusDetails._M_string_length = 0;
    local_d8.super_TestCaseResultHeader.statusDetails.field_2._M_local_buf[0] = '\0';
    xe::ri::List::List(&local_d8.resultItems);
    xe::parseTestCaseResultFromData(&this->m_testResultParser,&local_d8,caseData->m_ptr);
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_d8.super_TestCaseResultHeader.casePath._M_dataplus._M_p,
               local_d8.super_TestCaseResultHeader.casePath._M_dataplus._M_p +
               local_d8.super_TestCaseResultHeader.casePath._M_string_length);
    local_58._0_4_ = local_d8.super_TestCaseResultHeader.caseType;
    local_58._4_4_ = local_d8.super_TestCaseResultHeader.statusCode;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_d8.super_TestCaseResultHeader.statusDetails._M_dataplus._M_p
               ,local_d8.super_TestCaseResultHeader.statusDetails._M_dataplus._M_p +
                local_d8.super_TestCaseResultHeader.statusDetails._M_string_length);
    std::__cxx11::string::operator=((string *)local_120,(string *)local_78);
    local_120._32_8_ = local_58;
    std::__cxx11::string::operator=((string *)&local_f8,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    xe::ri::List::~List(&local_d8.resultItems);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.super_TestCaseResultHeader.statusDetails._M_dataplus._M_p !=
        &local_d8.super_TestCaseResultHeader.statusDetails.field_2) {
      operator_delete(local_d8.super_TestCaseResultHeader.statusDetails._M_dataplus._M_p,
                      CONCAT71(local_d8.super_TestCaseResultHeader.statusDetails.field_2.
                               _M_allocated_capacity._1_7_,
                               local_d8.super_TestCaseResultHeader.statusDetails.field_2.
                               _M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.super_TestCaseResultHeader.casePath._M_dataplus._M_p !=
        &local_d8.super_TestCaseResultHeader.casePath.field_2) {
      operator_delete(local_d8.super_TestCaseResultHeader.casePath._M_dataplus._M_p,
                      CONCAT71(local_d8.super_TestCaseResultHeader.casePath.field_2.
                               _M_allocated_capacity._1_7_,
                               local_d8.super_TestCaseResultHeader.casePath.field_2._M_local_buf[0])
                      + 1);
    }
  }
  std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::push_back
            (&this->m_result->resultHeaders,(value_type *)local_120);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->m_result->resultMap,(key_type *)local_120);
  *pmVar5 = (int)((long)pTVar1 - (long)pTVar2 >> 3) * 0x38e38e39;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,
                    CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,CONCAT71(local_120._17_7_,local_120[0x10]) + 1);
  }
  return;
}

Assistant:

void testCaseResultComplete (const xe::TestCaseResultPtr& caseData)
	{
		xe::TestCaseResultHeader	header;
		int							caseNdx	= (int)m_result.resultHeaders.size();

		header.casePath			= caseData->getTestCasePath();
		header.caseType			= xe::TESTCASETYPE_SELF_VALIDATE;
		header.statusCode		= caseData->getStatusCode();
		header.statusDetails	= caseData->getStatusDetails();

		if (header.statusCode == xe::TESTSTATUSCODE_LAST)
		{
			xe::TestCaseResult fullResult;

			xe::parseTestCaseResultFromData(&m_testResultParser, &fullResult, *caseData.get());

			header = xe::TestCaseResultHeader(fullResult);
		}

		// Insert into result list & map.
		m_result.resultHeaders.push_back(header);
		m_result.resultMap[header.casePath] = caseNdx;
	}